

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O1

void __thiscall ot::commissioner::tlv::Tlv::Tlv(Tlv *this,Type aType,uint8_t aValue,Scope aScope)

{
  pointer *ppuVar1;
  uint8_t *puVar2;
  uchar local_11;
  
  this->mScope = aScope;
  this->mType = aType;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == (uint8_t *)0x0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_realloc_insert<unsigned_char&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->mValue,(iterator)0x0,
               &local_11);
  }
  else {
    *puVar2 = aValue;
    ppuVar1 = &(this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  return;
}

Assistant:

Tlv::Tlv(Type aType, uint8_t aValue, Scope aScope)
    : mScope(aScope)
    , mType(aType)
{
    mValue.emplace_back(aValue);
}